

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::save_load_regressor<sparse_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,sparse_parameters *weights)

{
  bool bVar1;
  uint32_t uVar2;
  pointer ppVar3;
  ostream *poVar4;
  undefined8 uVar5;
  size_t sVar6;
  float *pfVar7;
  char *pcVar8;
  byte in_CL;
  byte in_DL;
  int __c;
  sparse_parameters *in_RSI;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> *__s;
  long in_RDI;
  sparse_parameters *in_R8;
  iterator iVar9;
  stringstream msg_1;
  iterator v_2;
  weight *v_1;
  stringstream __msg;
  uint64_t length;
  uint32_t old_i;
  uint64_t i;
  weight *v;
  iterator it;
  stringstream msg;
  size_t brw;
  sparse_iterator<float> *in_stack_fffffffffffff9e8;
  sparse_parameters *in_stack_fffffffffffff9f0;
  string *in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa10;
  int plineNumber;
  char *in_stack_fffffffffffffa18;
  vw_exception *in_stack_fffffffffffffa20;
  stringstream local_570 [15];
  undefined1 in_stack_fffffffffffffa9f;
  stringstream *in_stack_fffffffffffffaa0;
  size_t in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  io_buf *in_stack_fffffffffffffab8;
  char *in_stack_fffffffffffffbc0;
  size_t in_stack_fffffffffffffbc8;
  char *in_stack_fffffffffffffbd0;
  io_buf *in_stack_fffffffffffffbd8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_3d8;
  uint32_t local_3d0;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_3c8;
  uint32_t local_3c0;
  sparse_iterator<float> local_3b8;
  weight *local_3a8;
  undefined1 local_399;
  stringstream local_378 [16];
  ostream local_368;
  ulong local_1f0;
  uint local_1e4;
  ulong local_1e0;
  float *local_1c8;
  _Self local_1c0;
  _Self local_1b8;
  stringstream local_1b0 [16];
  ostream local_1a0;
  size_t local_28;
  sparse_parameters *local_20;
  byte local_12;
  byte local_11;
  sparse_parameters *local_10;
  long local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_28 = 1;
  if ((*(byte *)(in_RDI + 0x3619) & 1) == 0) {
    local_1e0 = 0;
    local_1e4 = 0;
    local_1f0 = 1L << ((byte)*(undefined4 *)(in_RDI + 0x50) & 0x3f);
    local_8 = in_RDI;
    if (local_11 == 0) {
      local_20 = in_R8;
      local_10 = in_RSI;
      iVar9 = sparse_parameters::begin(in_stack_fffffffffffff9f0);
      local_3c8._M_cur =
           (__node_type *)
           iVar9._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_3c0 = iVar9._stride;
      local_3b8._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
      _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
               (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_3c8._M_cur
      ;
      local_3b8._stride = local_3c0;
      while( true ) {
        iVar9 = sparse_parameters::end(in_stack_fffffffffffff9f0);
        local_3d8._M_cur =
             (__node_type *)
             iVar9._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
             _M_cur;
        local_3d0 = iVar9._stride;
        __s = &local_3d8;
        bVar1 = sparse_iterator<float>::operator!=
                          ((sparse_iterator<float> *)in_stack_fffffffffffff9f0,
                           in_stack_fffffffffffff9e8);
        if (!bVar1) break;
        pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x171d40);
        if ((*pfVar7 != 0.0) || (NAN(*pfVar7))) {
          pcVar8 = sparse_iterator<float>::index(&local_3b8,(char *)__s,__c);
          uVar2 = sparse_parameters::stride_shift(local_20);
          local_1e0 = (ulong)pcVar8 >> ((byte)uVar2 & 0x3f);
          std::__cxx11::stringstream::stringstream(local_570);
          std::ostream::operator<<(&stack0xfffffffffffffaa0,local_1e0);
          if (*(uint *)(local_8 + 0x50) < 0x1f) {
            local_1e4 = (uint)local_1e0;
            local_28 = bin_text_write_fixed
                                 (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                                  in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                                  (bool)in_stack_fffffffffffffa9f);
          }
          else {
            local_28 = bin_text_write_fixed
                                 (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                                  in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                                  (bool)in_stack_fffffffffffffa9f);
          }
          poVar4 = std::operator<<((ostream *)&stack0xfffffffffffffaa0,":");
          pfVar7 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x171e9f);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pfVar7);
          std::operator<<(poVar4,"\n");
          in_stack_fffffffffffff9f0 = local_10;
          sparse_iterator<float>::operator*((sparse_iterator<float> *)0x171ee1);
          sVar6 = bin_text_write_fixed
                            (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                             in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                             (bool)in_stack_fffffffffffffa9f);
          local_28 = sVar6 + local_28;
          std::__cxx11::stringstream::~stringstream(local_570);
        }
        sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffff9f0);
      }
    }
    else {
      do {
        local_28 = 1;
        if (*(uint *)(local_8 + 0x50) < 0x1f) {
          local_28 = io_buf::bin_read_fixed
                               (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                                in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
          local_1e0 = (ulong)local_1e4;
        }
        else {
          local_28 = io_buf::bin_read_fixed
                               (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                                in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
        }
        plineNumber = (int)((ulong)in_stack_fffffffffffffa10 >> 0x20);
        if (local_28 != 0) {
          if (local_1f0 <= local_1e0) {
            std::__cxx11::stringstream::stringstream(local_378);
            poVar4 = std::operator<<(&local_368,"Model content is corrupted, weight vector index ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1e0);
            poVar4 = std::operator<<(poVar4," must be less than total vector length ");
            std::ostream::operator<<(poVar4,local_1f0);
            local_399 = 1;
            uVar5 = __cxa_allocate_exception(0x38);
            std::__cxx11::stringstream::str();
            VW::vw_exception::vw_exception
                      (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,plineNumber,
                       in_stack_fffffffffffffa08);
            local_399 = 0;
            __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
          }
          local_3a8 = sparse_parameters::strided_index
                                (in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8);
          sVar6 = io_buf::bin_read_fixed
                            (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                             in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
          local_28 = sVar6 + local_28;
        }
      } while (local_28 != 0);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    local_1b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)in_stack_fffffffffffff9e8);
    while( true ) {
      local_1c0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)in_stack_fffffffffffff9e8);
      bVar1 = std::operator!=(&local_1b8,&local_1c0);
      if (!bVar1) break;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                    *)0x171827);
      local_1c8 = sparse_parameters::strided_index
                            (in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8);
      if ((*local_1c8 != 0.0) || (NAN(*local_1c8))) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                               *)0x17188f);
        std::operator<<(&local_1a0,(string *)ppVar3);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                      *)0x1718be);
        std::__cxx11::string::c_str();
        local_28 = bin_text_write_fixed
                             (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                              in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                              (bool)in_stack_fffffffffffffa9f);
        poVar4 = std::operator<<(&local_1a0,":");
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                               *)0x17192b);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar3->second);
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*local_1c8);
        std::operator<<(poVar4,"\n");
        bin_text_write_fixed
                  (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                   in_stack_fffffffffffffaa0,(bool)in_stack_fffffffffffffa9f);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                    *)in_stack_fffffffffffff9f0);
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return;
}

Assistant:

void save_load_regressor(vw& all, io_buf& model_file, bool read, bool text, T& weights)
{
  size_t brw = 1;

  if (all.print_invert)  // write readable model with feature names
  {
    stringstream msg;
    typedef std::map<std::string, size_t> str_int_map;

    for (str_int_map::iterator it = all.name_index_map.begin(); it != all.name_index_map.end(); ++it)
    {
      weight* v = &weights.strided_index(it->second);
      if (*v != 0.)
      {
        msg << it->first;
        brw = bin_text_write_fixed(model_file, (char*)it->first.c_str(), sizeof(*it->first.c_str()), msg, true);

        msg << ":" << it->second << ":" << *v << "\n";
        bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, true);
      }
    }
    return;
  }

  uint64_t i = 0;
  uint32_t old_i = 0;
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight* v = &weights.strided_index(i);
        brw += model_file.bin_read_fixed((char*)&(*v), sizeof(*v), "");
      }
    } while (brw > 0);
  else  // write
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        stringstream msg;
        msg << i;

        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        msg << ":" << *v << "\n";
        brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
      }
}